

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall kj::String::startsWith(String *this,StringPtr *other)

{
  char *pcVar1;
  bool bVar2;
  ArrayPtr<const_char> local_20;
  ArrayPtr<const_char> local_10;
  
  pcVar1 = (char *)(this->content).size_;
  local_10.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_10.ptr = (this->content).ptr;
  }
  local_10.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_10.size_ = (size_t)(pcVar1 + -1);
  }
  local_20.ptr = (other->content).ptr;
  local_20.size_ = (other->content).size_ - 1;
  bVar2 = ArrayPtr<const_char>::startsWith(&local_10,&local_20);
  return bVar2;
}

Assistant:

inline bool operator==(decltype(nullptr)) const { return size_ == 0; }